

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O1

bool testing::internal::
     TypeParameterizedTest<(anonymous_namespace)::ARTCorrectnessTest,_testing::internal::TemplateSel<(anonymous_namespace)::ARTCorrectnessTest_Node16KeyPrefixMerge_Test>,_testing::internal::Types<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
     ::Register(char *prefix,CodeLocation *code_location,char *case_name,char *test_names,int index,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *type_names)

{
  pointer pcVar1;
  char *pcVar2;
  undefined8 uVar3;
  _Alloc_hider _Var4;
  undefined1 auVar5 [8];
  bool bVar6;
  int iVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  TestFactoryBase *pTVar9;
  _Alloc_hider _Var10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  type_info *extraout_RDX;
  type_info *extraout_RDX_00;
  size_t sVar12;
  type_info *extraout_RDX_01;
  type_info *extraout_RDX_02;
  type_info *extraout_RDX_03;
  type_info *extraout_RDX_04;
  type_info *extraout_RDX_05;
  type_info *extraout_RDX_06;
  type_info *extraout_RDX_07;
  type_info *extraout_RDX_08;
  type_info *ptVar13;
  undefined4 in_register_00000084;
  long lVar14;
  type_info *ptVar15;
  type_info *ptVar16;
  type_info *ptVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  string local_3b8;
  CodeLocation local_398;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_368;
  type_info *local_360;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  CodeLocation local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  string local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_260;
  size_type local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  int local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_238;
  type_info *local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  CodeLocation *local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_210;
  size_type local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  int local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  undefined1 local_1c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  string local_168;
  undefined1 local_148 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  _Alloc_hider local_128;
  size_type __dnew_1;
  undefined1 local_118;
  undefined7 uStack_117;
  undefined8 uStack_110;
  int local_108;
  _Alloc_hider local_100;
  size_type __dnew_2;
  undefined8 local_f0;
  undefined8 uStack_e8;
  int local_e0;
  _Alloc_hider local_d8;
  size_type __dnew_3;
  undefined8 local_c8;
  undefined8 uStack_c0;
  int local_b8;
  undefined1 local_b0 [8];
  size_type __dnew;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  int local_90;
  GTestLog local_84;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  int local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  int local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_218 = code_location;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"","",test_names,CONCAT44(in_register_00000084,index));
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_58,"");
  local_100._M_p = (pointer)&stack0xffffffffffffff10;
  pcVar1 = (pbVar8->_M_dataplus)._M_p;
  paVar11 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == paVar11) {
    local_f0 = paVar11->_M_allocated_capacity;
    uStack_e8 = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_f0 = paVar11->_M_allocated_capacity;
    local_100._M_p = pcVar1;
  }
  __dnew_2 = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &stack0xffffffffffffff00,"ARTCorrectnessTest");
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar18 = &pbVar8->field_2;
  if (paVar11 == paVar18) {
    local_80.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
    local_80.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_80.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
    local_80._M_dataplus._M_p = (pointer)paVar11;
  }
  local_80._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar18;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_80,"/");
  local_d8._M_p = (pointer)&stack0xffffffffffffff38;
  pcVar1 = (pbVar8->_M_dataplus)._M_p;
  paVar11 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == paVar11) {
    local_c8 = paVar11->_M_allocated_capacity;
    uStack_c0 = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_c8 = paVar11->_M_allocated_capacity;
    local_d8._M_p = pcVar1;
  }
  __dnew_3 = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pcVar1 = (local_218->file)._M_dataplus._M_p;
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffff28,*(char **)(pcVar1 + 0x20),
                     *(size_type *)(pcVar1 + 0x28));
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar18 = &pbVar8->field_2;
  if (paVar11 == paVar18) {
    local_2e8.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
    local_2e8.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_2e8.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
    local_2e8._M_dataplus._M_p = (pointer)paVar11;
  }
  local_2e8._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar18;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  local_238 = &local_228;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"Node16KeyPrefixMerge","");
  local_128._M_p = (pointer)local_238;
  ptVar13 = extraout_RDX;
  if (local_230 != (type_info *)0x0) {
    ptVar17 = local_230 + (long)local_238;
    do {
      paVar11 = local_238;
      iVar7 = isspace((uint)(byte)ptVar17[-1]);
      local_128._M_p = (pointer)paVar11;
      ptVar13 = extraout_RDX_00;
      if (iVar7 == 0) break;
      paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(ptVar17 + -1);
      lVar14 = (long)paVar18 - (long)paVar11;
      if ((local_230 != (type_info *)(lVar14 + 1)) &&
         (sVar12 = (long)local_230 - (lVar14 + 1), sVar12 != 0)) {
        ptVar13 = (type_info *)(local_238->_M_local_buf + lVar14);
        if (sVar12 == 1) {
          *ptVar13 = ptVar13[1];
        }
        else {
          memmove(ptVar13,(type_info *)(local_238->_M_local_buf + lVar14 + 1),sVar12);
        }
      }
      ptVar13 = local_230 + -1;
      ((type_info *)(local_238->_M_local_buf + -1))[(long)local_230] = (type_info)0x0;
      ptVar17 = (type_info *)(local_238->_M_local_buf + lVar14);
      local_128._M_p = (pointer)local_238;
      local_230 = ptVar13;
    } while (paVar18 != paVar11);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_p == &local_228) {
    uStack_110 = local_228._8_8_;
    local_128._M_p = (pointer)&stack0xfffffffffffffee8;
  }
  uStack_117 = local_228._M_allocated_capacity._1_7_;
  local_118 = local_228._M_local_buf[0];
  __dnew_1 = (size_type)local_230;
  local_230 = (type_info *)0x0;
  local_228._M_local_buf[0] = '\0';
  local_370 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_p;
  local_238 = &local_228;
  GetTypeName_abi_cxx11_
            ((string *)local_b0,
             (internal *)
             &unodb::mutex_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::
              typeinfo,ptVar13);
  auVar5 = local_b0;
  local_398.file._M_dataplus._M_p = (pointer)&local_398.file.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_398,*(long *)prefix,*(long *)(prefix + 8) + *(long *)prefix);
  iVar7 = *(int *)(prefix + 0x20);
  pcVar2 = *(char **)prefix;
  local_398.line = iVar7;
  bVar6 = IsTrue(true);
  if (!bVar6) {
    GTestLog::GTestLog((GTestLog *)&local_2c8,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x201);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
               ,0x6a);
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x302660);
    }
    else {
      sVar12 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar2,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar7);
    GTestLog::~GTestLog((GTestLog *)&local_2c8);
  }
  pcVar2 = *(char **)prefix;
  iVar7 = *(int *)(prefix + 0x20);
  bVar6 = IsTrue(true);
  if (!bVar6) {
    GTestLog::GTestLog((GTestLog *)&local_2c8,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x216);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
               ,0x6f);
    if (pcVar2 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x302660);
    }
    else {
      sVar12 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar2,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar7);
    GTestLog::~GTestLog((GTestLog *)&local_2c8);
  }
  pTVar9 = (TestFactoryBase *)operator_new(8);
  pTVar9->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_002fb708;
  MakeAndRegisterTestInfo
            (&local_2e8,local_370->_M_local_buf,(char *)auVar5,(char *)0x0,&local_398,
             &TypeIdHelper<(anonymous_namespace)::ARTCorrectnessTest<unodb::mutex_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>>
              ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398.file._M_dataplus._M_p != &local_398.file.field_2) {
    operator_delete(local_398.file._M_dataplus._M_p,local_398.file.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_b0 != (undefined1  [8])&local_a0) {
    operator_delete((void *)local_b0,local_a0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)&stack0xfffffffffffffee8) {
    operator_delete(local_128._M_p,_local_118 + 1);
  }
  if (local_238 != &local_228) {
    operator_delete(local_238,
                    CONCAT71(local_228._M_allocated_capacity._1_7_,local_228._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  if (local_d8._M_p != (pointer)&stack0xffffffffffffff38) {
    operator_delete(local_d8._M_p,local_c8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (local_100._M_p != (pointer)&stack0xffffffffffffff10) {
    operator_delete(local_100._M_p,local_f0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_260 = &local_250;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(prefix + 0x10);
  if (*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)prefix == paVar11) {
    local_250._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_250._8_8_ = *(undefined8 *)(prefix + 0x18);
  }
  else {
    local_250._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_260 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  **)prefix;
  }
  local_258 = *(size_type *)(prefix + 8);
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)prefix = paVar11;
  prefix[8] = '\0';
  prefix[9] = '\0';
  prefix[10] = '\0';
  prefix[0xb] = '\0';
  prefix[0xc] = '\0';
  prefix[0xd] = '\0';
  prefix[0xe] = '\0';
  prefix[0xf] = '\0';
  prefix[0x10] = '\0';
  local_240 = *(int *)(prefix + 0x20);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity =
       local_58.field_2._M_allocated_capacity & 0xffffffffffffff00;
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_58,"");
  local_100._M_p = (pointer)&stack0xffffffffffffff10;
  pcVar1 = (pbVar8->_M_dataplus)._M_p;
  paVar11 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == paVar11) {
    local_f0 = paVar11->_M_allocated_capacity;
    uStack_e8 = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_f0 = paVar11->_M_allocated_capacity;
    local_100._M_p = pcVar1;
  }
  __dnew_2 = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &stack0xffffffffffffff00,"ARTCorrectnessTest");
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar18 = &pbVar8->field_2;
  if (paVar11 == paVar18) {
    local_80.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
    local_80.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_80.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
    local_80._M_dataplus._M_p = (pointer)paVar11;
  }
  local_80._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar18;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_80,"/");
  local_d8._M_p = (pointer)&stack0xffffffffffffff38;
  pcVar1 = (pbVar8->_M_dataplus)._M_p;
  paVar11 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == paVar11) {
    local_c8 = paVar11->_M_allocated_capacity;
    uStack_c0 = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_c8 = paVar11->_M_allocated_capacity;
    local_d8._M_p = pcVar1;
  }
  __dnew_3 = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pcVar1 = (local_218->file)._M_dataplus._M_p;
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffff28,*(char **)(pcVar1 + 0x40),
                     *(size_type *)(pcVar1 + 0x48));
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar18 = &pbVar8->field_2;
  if (paVar11 == paVar18) {
    local_308.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
    local_308.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_308.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
    local_308._M_dataplus._M_p = (pointer)paVar11;
  }
  local_308._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar18;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  paVar11 = &local_188.field_2;
  local_b0 = (undefined1  [8])0x14;
  local_188._M_dataplus._M_p = (pointer)paVar11;
  local_188._M_dataplus._M_p =
       std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                 (&local_188,(size_type *)local_b0,0);
  local_188.field_2._M_allocated_capacity = (size_type)local_b0;
  *(undefined8 *)local_188._M_dataplus._M_p = 0x654b363165646f4e;
  *(undefined8 *)(local_188._M_dataplus._M_p + 8) = 0x4d78696665725079;
  *(undefined4 *)(local_188._M_dataplus._M_p + 0x10) = 0x65677265;
  local_188._M_string_length = (size_type)local_b0;
  *(type_info *)(local_188._M_dataplus._M_p + (long)local_b0) = (type_info)0x0;
  _Var10._M_p = local_188._M_dataplus._M_p;
  ptVar13 = extraout_RDX_01;
  if (local_b0 != (undefined1  [8])0x0) {
    ptVar17 = (type_info *)((long)local_b0 + (long)local_188._M_dataplus._M_p);
    do {
      _Var4._M_p = local_188._M_dataplus._M_p;
      iVar7 = isspace((uint)(byte)ptVar17[-1]);
      _Var10._M_p = _Var4._M_p;
      ptVar13 = extraout_RDX_02;
      if (iVar7 == 0) break;
      paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(ptVar17 + -1);
      lVar14 = (long)paVar18 - (long)_Var4._M_p;
      if (((type_info *)local_188._M_string_length != (type_info *)(lVar14 + 1)) &&
         (sVar12 = local_188._M_string_length - (lVar14 + 1), sVar12 != 0)) {
        ptVar13 = (type_info *)(local_188._M_dataplus._M_p + lVar14);
        if (sVar12 == 1) {
          *ptVar13 = ptVar13[1];
        }
        else {
          memmove(ptVar13,(type_info *)(local_188._M_dataplus._M_p + lVar14 + 1),sVar12);
        }
      }
      ptVar13 = (type_info *)(local_188._M_string_length + -1);
      ((type_info *)(local_188._M_dataplus._M_p + -1))[local_188._M_string_length] = (type_info)0x0;
      ptVar17 = (type_info *)(local_188._M_dataplus._M_p + lVar14);
      _Var10._M_p = local_188._M_dataplus._M_p;
      local_188._M_string_length = (size_type)ptVar13;
    } while (paVar18 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)_Var4._M_p);
  }
  local_128._M_p = _Var10._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var10._M_p == paVar11) {
    uStack_110 = local_188.field_2._8_8_;
    local_128._M_p = (pointer)&stack0xfffffffffffffee8;
  }
  _Var10._M_p = local_128._M_p;
  _local_118 = local_188.field_2._M_allocated_capacity;
  __dnew_1 = local_188._M_string_length;
  local_188._M_string_length = 0;
  local_188.field_2._M_allocated_capacity =
       local_188.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_188._M_dataplus._M_p = (pointer)paVar11;
  GetTypeName_abi_cxx11_
            ((string *)local_b0,
             (internal *)
             &unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::
              typeinfo,ptVar13);
  auVar5 = local_b0;
  local_2c8.file._M_dataplus._M_p = (pointer)&local_2c8.file.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2c8,local_260,local_258 + (long)local_260);
  iVar7 = local_240;
  paVar11 = local_260;
  local_2c8.line = local_240;
  bVar6 = IsTrue(true);
  if (!bVar6) {
    GTestLog::GTestLog((GTestLog *)&local_210,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x201);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
               ,0x6a);
    if (paVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x302660);
    }
    else {
      sVar12 = strlen(paVar11->_M_local_buf);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,paVar11->_M_local_buf,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar7);
    GTestLog::~GTestLog((GTestLog *)&local_210);
  }
  iVar7 = local_240;
  paVar11 = local_260;
  bVar6 = IsTrue(true);
  if (!bVar6) {
    GTestLog::GTestLog((GTestLog *)&local_210,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x216);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
               ,0x6f);
    if (paVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x302660);
    }
    else {
      sVar12 = strlen(paVar11->_M_local_buf);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,paVar11->_M_local_buf,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar7);
    GTestLog::~GTestLog((GTestLog *)&local_210);
  }
  pTVar9 = (TestFactoryBase *)operator_new(8);
  pTVar9->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_002fb7a0;
  MakeAndRegisterTestInfo
            (&local_308,_Var10._M_p,(char *)auVar5,(char *)0x0,&local_2c8,
             &TypeIdHelper<(anonymous_namespace)::ARTCorrectnessTest<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>>
              ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8.file._M_dataplus._M_p != &local_2c8.file.field_2) {
    operator_delete(local_2c8.file._M_dataplus._M_p,local_2c8.file.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_b0 != (undefined1  [8])&local_a0) {
    operator_delete((void *)local_b0,local_a0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)&stack0xfffffffffffffee8) {
    operator_delete(local_128._M_p,(size_t)(_local_118 + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  if (local_d8._M_p != (pointer)&stack0xffffffffffffff38) {
    operator_delete(local_d8._M_p,local_c8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (local_100._M_p != (pointer)&stack0xffffffffffffff10) {
    operator_delete(local_100._M_p,local_f0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_210 = &local_200;
  if (local_260 == &local_250) {
    local_200._8_8_ = local_250._8_8_;
  }
  else {
    local_210 = local_260;
  }
  local_200._M_allocated_capacity = local_250._M_allocated_capacity;
  local_208 = local_258;
  local_258 = 0;
  local_250._M_allocated_capacity = local_250._M_allocated_capacity & 0xffffffffffffff00;
  local_1f0 = local_240;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity =
       local_58.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_260 = &local_250;
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_58,"");
  local_100._M_p = (pointer)&stack0xffffffffffffff10;
  pcVar1 = (pbVar8->_M_dataplus)._M_p;
  paVar11 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == paVar11) {
    local_f0 = paVar11->_M_allocated_capacity;
    uStack_e8 = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_f0 = paVar11->_M_allocated_capacity;
    local_100._M_p = pcVar1;
  }
  __dnew_2 = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &stack0xffffffffffffff00,"ARTCorrectnessTest");
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar18 = &pbVar8->field_2;
  if (paVar11 == paVar18) {
    local_80.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
    local_80.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_80.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
    local_80._M_dataplus._M_p = (pointer)paVar11;
  }
  local_80._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar18;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_80,"/");
  local_d8._M_p = (pointer)&stack0xffffffffffffff38;
  pcVar1 = (pbVar8->_M_dataplus)._M_p;
  paVar11 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == paVar11) {
    local_c8 = paVar11->_M_allocated_capacity;
    uStack_c0 = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_c8 = paVar11->_M_allocated_capacity;
    local_d8._M_p = pcVar1;
  }
  __dnew_3 = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pcVar1 = (local_218->file)._M_dataplus._M_p;
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffff28,*(char **)(pcVar1 + 0x60),
                     *(size_type *)(pcVar1 + 0x68));
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar18 = &pbVar8->field_2;
  if (paVar11 == paVar18) {
    local_328.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
    local_328.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_328.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
    local_328._M_dataplus._M_p = (pointer)paVar11;
  }
  local_328._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar18;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  paVar11 = &local_1a8.field_2;
  local_128._M_p = (pointer)0x14;
  local_1a8._M_dataplus._M_p = (pointer)paVar11;
  local_1a8._M_dataplus._M_p =
       std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                 (&local_1a8,(size_type *)&stack0xfffffffffffffed8,0);
  local_1a8.field_2._M_allocated_capacity = (size_type)local_128._M_p;
  *(undefined8 *)local_1a8._M_dataplus._M_p = 0x654b363165646f4e;
  *(undefined8 *)(local_1a8._M_dataplus._M_p + 8) = 0x4d78696665725079;
  *(undefined4 *)(local_1a8._M_dataplus._M_p + 0x10) = 0x65677265;
  local_1a8._M_string_length = (size_type)local_128._M_p;
  *(type_info *)(local_1a8._M_dataplus._M_p + (long)local_128._M_p) = (type_info)0x0;
  _Var10._M_p = local_1a8._M_dataplus._M_p;
  ptVar13 = extraout_RDX_03;
  if ((type_info *)local_128._M_p != (type_info *)0x0) {
    ptVar17 = (type_info *)(local_128._M_p + (long)local_1a8._M_dataplus._M_p);
    do {
      _Var4._M_p = local_1a8._M_dataplus._M_p;
      iVar7 = isspace((uint)(byte)ptVar17[-1]);
      _Var10._M_p = _Var4._M_p;
      ptVar13 = extraout_RDX_04;
      if (iVar7 == 0) break;
      paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(ptVar17 + -1);
      lVar14 = (long)paVar18 - (long)_Var4._M_p;
      if (((type_info *)local_1a8._M_string_length != (type_info *)(lVar14 + 1)) &&
         (sVar12 = local_1a8._M_string_length - (lVar14 + 1), sVar12 != 0)) {
        ptVar13 = (type_info *)(local_1a8._M_dataplus._M_p + lVar14);
        if (sVar12 == 1) {
          *ptVar13 = ptVar13[1];
        }
        else {
          memmove(ptVar13,(type_info *)(local_1a8._M_dataplus._M_p + lVar14 + 1),sVar12);
        }
      }
      ptVar13 = (type_info *)(local_1a8._M_string_length + -1);
      ((type_info *)(local_1a8._M_dataplus._M_p + -1))[local_1a8._M_string_length] = (type_info)0x0;
      ptVar17 = (type_info *)(local_1a8._M_dataplus._M_p + lVar14);
      _Var10._M_p = local_1a8._M_dataplus._M_p;
      local_1a8._M_string_length = (size_type)ptVar13;
    } while (paVar18 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)_Var4._M_p);
  }
  local_b0 = (undefined1  [8])_Var10._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var10._M_p == paVar11) {
    local_a0._8_8_ = local_1a8.field_2._8_8_;
    local_b0 = (undefined1  [8])&local_a0;
  }
  auVar5 = local_b0;
  local_a0._M_allocated_capacity = local_1a8.field_2._M_allocated_capacity;
  __dnew = local_1a8._M_string_length;
  local_1a8._M_string_length = 0;
  local_1a8.field_2._M_allocated_capacity =
       local_1a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_1a8._M_dataplus._M_p = (pointer)paVar11;
  GetTypeName_abi_cxx11_
            (&local_168,
             (internal *)
             &unodb::
              db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
              ::typeinfo,ptVar13);
  _Var10._M_p = local_168._M_dataplus._M_p;
  local_128._M_p = &stack0xfffffffffffffee8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xfffffffffffffed8,local_210,local_208 + (long)local_210);
  iVar7 = local_1f0;
  paVar11 = local_210;
  local_108 = local_1f0;
  bVar6 = IsTrue(true);
  if (!bVar6) {
    GTestLog::GTestLog((GTestLog *)local_148,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x201);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
               ,0x6a);
    if (paVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x302660);
    }
    else {
      sVar12 = strlen(paVar11->_M_local_buf);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,paVar11->_M_local_buf,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar7);
    GTestLog::~GTestLog((GTestLog *)local_148);
  }
  iVar7 = local_1f0;
  paVar11 = local_210;
  bVar6 = IsTrue(true);
  if (!bVar6) {
    GTestLog::GTestLog((GTestLog *)local_148,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x216);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
               ,0x6f);
    if (paVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x302660);
    }
    else {
      sVar12 = strlen(paVar11->_M_local_buf);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,paVar11->_M_local_buf,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar7);
    GTestLog::~GTestLog((GTestLog *)local_148);
  }
  pTVar9 = (TestFactoryBase *)operator_new(8);
  pTVar9->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_002fb838;
  MakeAndRegisterTestInfo
            (&local_328,(char *)auVar5,_Var10._M_p,(char *)0x0,
             (CodeLocation *)&stack0xfffffffffffffed8,
             &TypeIdHelper<(anonymous_namespace)::ARTCorrectnessTest<unodb::db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>>
              ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar9);
  if (local_128._M_p != &stack0xfffffffffffffee8) {
    operator_delete(local_128._M_p,(size_t)(_local_118 + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if (local_b0 != (undefined1  [8])&local_a0) {
    operator_delete((void *)local_b0,(size_t)(local_a0._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  if (local_d8._M_p != (pointer)&stack0xffffffffffffff38) {
    operator_delete(local_d8._M_p,local_c8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (local_100._M_p != (pointer)&stack0xffffffffffffff10) {
    operator_delete(local_100._M_p,local_f0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_b0 = (undefined1  [8])&local_a0;
  if (local_210 == &local_200) {
    local_a0._8_8_ = local_200._8_8_;
  }
  else {
    local_b0 = (undefined1  [8])local_210;
  }
  local_a0._M_allocated_capacity = local_200._M_allocated_capacity;
  __dnew = local_208;
  local_208 = 0;
  local_200._M_allocated_capacity = local_200._M_allocated_capacity & 0xffffffffffffff00;
  local_90 = local_1f0;
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  local_168._M_string_length = 0;
  local_168.field_2._M_allocated_capacity =
       local_168.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_210 = &local_200;
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_168,"");
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar18 = &pbVar8->field_2;
  if (paVar11 == paVar18) {
    local_58.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
    local_58.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_58.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
    local_58._M_dataplus._M_p = (pointer)paVar11;
  }
  local_58._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar18;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_58,"ARTCorrectnessTest");
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar18 = &pbVar8->field_2;
  if (paVar11 == paVar18) {
    local_80.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
    local_80.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_80.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
    local_80._M_dataplus._M_p = (pointer)paVar11;
  }
  local_80._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar18;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_80,"/");
  local_d8._M_p = (pointer)&stack0xffffffffffffff38;
  pcVar1 = (pbVar8->_M_dataplus)._M_p;
  paVar11 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == paVar11) {
    local_c8 = paVar11->_M_allocated_capacity;
    uStack_c0 = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_c8 = paVar11->_M_allocated_capacity;
    local_d8._M_p = pcVar1;
  }
  __dnew_3 = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pcVar1 = (local_218->file)._M_dataplus._M_p;
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffff28,*(char **)(pcVar1 + 0x80),
                     *(size_type *)(pcVar1 + 0x88));
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar18 = &pbVar8->field_2;
  if (paVar11 == paVar18) {
    local_348.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
    local_348.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_348.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
    local_348._M_dataplus._M_p = (pointer)paVar11;
  }
  local_348._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar18;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  ptVar17 = (type_info *)(local_1c8 + 0x10);
  local_100._M_p = (pointer)0x14;
  local_1c8._0_8_ = ptVar17;
  local_1c8._0_8_ =
       std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
                  (size_type *)&stack0xffffffffffffff00,0);
  local_1b8._M_allocated_capacity = (size_type)local_100._M_p;
  *(undefined8 *)local_1c8._0_8_ = 0x654b363165646f4e;
  *(undefined8 *)(local_1c8._0_8_ + 8) = 0x4d78696665725079;
  *(undefined4 *)(local_1c8._0_8_ + 0x10) = 0x65677265;
  local_1c8._8_8_ = local_100._M_p;
  *(type_info *)(local_1c8._0_8_ + (long)local_100._M_p) = (type_info)0x0;
  local_148._0_8_ = local_1c8._0_8_;
  ptVar13 = extraout_RDX_05;
  if ((type_info *)local_100._M_p != (type_info *)0x0) {
    ptVar15 = (type_info *)(local_100._M_p + local_1c8._0_8_);
    do {
      uVar3 = local_1c8._0_8_;
      iVar7 = isspace((uint)(byte)ptVar15[-1]);
      local_148._0_8_ = uVar3;
      ptVar13 = extraout_RDX_06;
      if (iVar7 == 0) break;
      ptVar16 = ptVar15 + -1;
      lVar14 = (long)ptVar16 - uVar3;
      if (((type_info *)local_1c8._8_8_ != (type_info *)(lVar14 + 1)) &&
         (sVar12 = local_1c8._8_8_ - (lVar14 + 1), sVar12 != 0)) {
        ptVar13 = (type_info *)(local_1c8._0_8_ + lVar14);
        if (sVar12 == 1) {
          *ptVar13 = ptVar13[1];
        }
        else {
          memmove(ptVar13,(type_info *)(local_1c8._0_8_ + lVar14 + 1),sVar12);
        }
      }
      ptVar13 = (type_info *)(local_1c8._8_8_ + -1);
      ((type_info *)(local_1c8._0_8_ + -1))[local_1c8._8_8_] = (type_info)0x0;
      ptVar15 = (type_info *)(local_1c8._0_8_ + lVar14);
      local_148._0_8_ = local_1c8._0_8_;
      local_1c8._8_8_ = ptVar13;
    } while (ptVar16 != (type_info *)uVar3);
  }
  if ((type_info *)local_148._0_8_ == ptVar17) {
    local_138._8_8_ = local_1b8._8_8_;
    local_148._0_8_ = (type_info *)(local_148 + 0x10);
  }
  uVar3 = local_148._0_8_;
  local_138._M_allocated_capacity = local_1b8._M_allocated_capacity;
  local_148._8_8_ = local_1c8._8_8_;
  local_1c8._8_8_ = 0;
  local_1b8._M_allocated_capacity = local_1b8._M_allocated_capacity & 0xffffffffffffff00;
  local_1c8._0_8_ = ptVar17;
  GetTypeName_abi_cxx11_
            (&local_280,
             (internal *)
             &unodb::
              mutex_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
              ::typeinfo,ptVar13);
  _Var10._M_p = local_280._M_dataplus._M_p;
  local_100._M_p = (pointer)&stack0xffffffffffffff10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xffffffffffffff00,local_b0,(char *)((long)local_b0 + __dnew));
  iVar7 = local_90;
  auVar5 = local_b0;
  local_e0 = local_90;
  bVar6 = IsTrue(true);
  if (!bVar6) {
    GTestLog::GTestLog((GTestLog *)&local_2a0,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x201);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
               ,0x6a);
    if (auVar5 == (undefined1  [8])0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x302660);
    }
    else {
      sVar12 = strlen((char *)auVar5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,(char *)auVar5,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar7);
    GTestLog::~GTestLog((GTestLog *)&local_2a0);
  }
  iVar7 = local_90;
  auVar5 = local_b0;
  bVar6 = IsTrue(true);
  if (!bVar6) {
    GTestLog::GTestLog((GTestLog *)&local_2a0,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x216);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
               ,0x6f);
    if (auVar5 == (undefined1  [8])0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x302660);
    }
    else {
      sVar12 = strlen((char *)auVar5);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,(char *)auVar5,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar7);
    GTestLog::~GTestLog((GTestLog *)&local_2a0);
  }
  pTVar9 = (TestFactoryBase *)operator_new(8);
  pTVar9->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_002fb8d0;
  MakeAndRegisterTestInfo
            (&local_348,(char *)uVar3,_Var10._M_p,(char *)0x0,
             (CodeLocation *)&stack0xffffffffffffff00,
             &TypeIdHelper<(anonymous_namespace)::ARTCorrectnessTest<unodb::mutex_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>>
              ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar9);
  if (local_100._M_p != (pointer)&stack0xffffffffffffff10) {
    operator_delete(local_100._M_p,local_f0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if ((type_info *)local_148._0_8_ != (type_info *)(local_148 + 0x10)) {
    operator_delete((void *)local_148._0_8_,(size_t)(local_138._M_allocated_capacity + 1));
  }
  if ((type_info *)local_1c8._0_8_ != (type_info *)(local_1c8 + 0x10)) {
    operator_delete((void *)local_1c8._0_8_,local_1b8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  if (local_d8._M_p != (pointer)&stack0xffffffffffffff38) {
    operator_delete(local_d8._M_p,local_c8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  if (local_b0 == (undefined1  [8])&local_a0) {
    local_58.field_2._8_8_ = local_a0._8_8_;
  }
  else {
    local_58._M_dataplus._M_p = (pointer)local_b0;
  }
  local_58.field_2._M_allocated_capacity = local_a0._M_allocated_capacity;
  local_58._M_string_length = __dnew;
  __dnew = 0;
  local_a0._M_allocated_capacity = local_a0._M_allocated_capacity & 0xffffffffffffff00;
  local_38 = local_90;
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  local_2a0._M_string_length = 0;
  local_2a0.field_2._M_local_buf[0] = '\0';
  local_b0 = (undefined1  [8])&local_a0;
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_2a0,"");
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar18 = &pbVar8->field_2;
  if (paVar11 == paVar18) {
    local_280.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
    local_280.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_280.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
    local_280._M_dataplus._M_p = (pointer)paVar11;
  }
  local_280._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar18;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_280,"ARTCorrectnessTest");
  local_148._0_8_ = local_148 + 0x10;
  pcVar1 = (pbVar8->_M_dataplus)._M_p;
  paVar11 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == paVar11) {
    local_138._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_138._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_138._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_148._0_8_ = pcVar1;
  }
  local_148._8_8_ = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148
                      ,"/");
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar18 = &pbVar8->field_2;
  if (paVar11 == paVar18) {
    local_80.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
    local_80.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_80.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
    local_80._M_dataplus._M_p = (pointer)paVar11;
  }
  local_80._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar18;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pcVar1 = (local_218->file)._M_dataplus._M_p;
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_80,*(char **)(pcVar1 + 0xa0),*(size_type *)(pcVar1 + 0xa8));
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar18 = &pbVar8->field_2;
  if (paVar11 == paVar18) {
    local_168.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
    local_168.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_168.field_2._M_allocated_capacity = paVar18->_M_allocated_capacity;
    local_168._M_dataplus._M_p = (pointer)paVar11;
  }
  local_168._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar18;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  paVar11 = &local_1e8.field_2;
  local_d8._M_p = (pointer)0x14;
  local_1e8._M_dataplus._M_p = (pointer)paVar11;
  local_1e8._M_dataplus._M_p =
       std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                 (&local_1e8,(size_type *)&stack0xffffffffffffff28,0);
  local_1e8.field_2._M_allocated_capacity = (size_type)local_d8._M_p;
  *(undefined8 *)local_1e8._M_dataplus._M_p = 0x654b363165646f4e;
  *(undefined8 *)(local_1e8._M_dataplus._M_p + 8) = 0x4d78696665725079;
  *(undefined4 *)(local_1e8._M_dataplus._M_p + 0x10) = 0x65677265;
  local_1e8._M_string_length = (size_type)local_d8._M_p;
  *(type_info *)(local_1e8._M_dataplus._M_p + (long)local_d8._M_p) = (type_info)0x0;
  local_368 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p;
  ptVar13 = extraout_RDX_07;
  if ((type_info *)local_d8._M_p != (type_info *)0x0) {
    ptVar17 = (type_info *)(local_d8._M_p + (long)local_1e8._M_dataplus._M_p);
    do {
      _Var10._M_p = local_1e8._M_dataplus._M_p;
      iVar7 = isspace((uint)(byte)ptVar17[-1]);
      local_368 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var10._M_p;
      ptVar13 = extraout_RDX_08;
      if (iVar7 == 0) break;
      paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(ptVar17 + -1);
      lVar14 = (long)paVar18 - (long)_Var10._M_p;
      if (((type_info *)local_1e8._M_string_length != (type_info *)(lVar14 + 1)) &&
         (sVar12 = local_1e8._M_string_length - (lVar14 + 1), sVar12 != 0)) {
        ptVar13 = (type_info *)(local_1e8._M_dataplus._M_p + lVar14);
        if (sVar12 == 1) {
          *ptVar13 = ptVar13[1];
        }
        else {
          memmove(ptVar13,(type_info *)(local_1e8._M_dataplus._M_p + lVar14 + 1),sVar12);
        }
      }
      ptVar13 = (type_info *)(local_1e8._M_string_length + -1);
      ((type_info *)(local_1e8._M_dataplus._M_p + -1))[local_1e8._M_string_length] = (type_info)0x0;
      ptVar17 = (type_info *)(local_1e8._M_dataplus._M_p + lVar14);
      local_368 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e8._M_dataplus._M_p;
      local_1e8._M_string_length = (size_type)ptVar13;
    } while (paVar18 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)_Var10._M_p);
  }
  if (local_368 == paVar11) {
    local_358._8_8_ = local_1e8.field_2._8_8_;
    local_368 = &local_358;
  }
  paVar18 = local_368;
  local_358._M_allocated_capacity = local_1e8.field_2._M_allocated_capacity;
  local_360 = (type_info *)local_1e8._M_string_length;
  local_1e8._M_string_length = 0;
  local_1e8.field_2._M_allocated_capacity =
       local_1e8.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_1e8._M_dataplus._M_p = (pointer)paVar11;
  GetTypeName_abi_cxx11_
            (&local_3b8,
             (internal *)
             &unodb::
              olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>
              ::typeinfo,ptVar13);
  _Var10._M_p = local_3b8._M_dataplus._M_p;
  local_d8._M_p = (pointer)&stack0xffffffffffffff38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xffffffffffffff28,local_58._M_dataplus._M_p,
             local_58._M_dataplus._M_p + local_58._M_string_length);
  iVar7 = local_38;
  _Var4._M_p = local_58._M_dataplus._M_p;
  local_b8 = local_38;
  bVar6 = IsTrue(true);
  if (!bVar6) {
    GTestLog::GTestLog(&local_84,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x201);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
               ,0x6a);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var4._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x302660);
    }
    else {
      sVar12 = strlen(_Var4._M_p);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,_Var4._M_p,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar7);
    GTestLog::~GTestLog(&local_84);
  }
  iVar7 = local_38;
  _Var4._M_p = local_58._M_dataplus._M_p;
  bVar6 = IsTrue(true);
  if (!bVar6) {
    GTestLog::GTestLog(&local_84,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x216);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
               ,0x6f);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var4._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x302660);
    }
    else {
      sVar12 = strlen(_Var4._M_p);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,_Var4._M_p,sVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar7);
    GTestLog::~GTestLog(&local_84);
  }
  pTVar9 = (TestFactoryBase *)operator_new(8);
  pTVar9->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_002fb968;
  MakeAndRegisterTestInfo
            (&local_168,paVar18->_M_local_buf,_Var10._M_p,(char *)0x0,
             (CodeLocation *)&stack0xffffffffffffff28,
             &TypeIdHelper<(anonymous_namespace)::ARTCorrectnessTest<unodb::olc_db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>>
              ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar9);
  if (local_d8._M_p != (pointer)&stack0xffffffffffffff38) {
    operator_delete(local_d8._M_p,local_c8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
    operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
  }
  if (local_368 != &local_358) {
    operator_delete(local_368,(size_t)(local_358._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
    operator_delete((void *)local_148._0_8_,local_138._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,
                    CONCAT71(local_2a0.field_2._M_allocated_capacity._1_7_,
                             local_2a0.field_2._M_local_buf[0]) + 1);
  }
  uVar3 = local_58.field_2._M_allocated_capacity;
  paVar11 = &local_58.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p == paVar11) {
    local_80.field_2._8_8_ = local_58.field_2._8_8_;
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  }
  else {
    local_80._M_dataplus._M_p = local_58._M_dataplus._M_p;
  }
  local_80.field_2._M_allocated_capacity = local_58.field_2._M_allocated_capacity;
  local_80._M_string_length = local_58._M_string_length;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity =
       local_58.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_60 = local_38;
  local_58._M_dataplus._M_p = (pointer)paVar11;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,uVar3 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_b0 != (undefined1  [8])&local_a0) {
    operator_delete((void *)local_b0,local_a0._M_allocated_capacity + 1);
  }
  if (local_210 != &local_200) {
    operator_delete(local_210,local_200._M_allocated_capacity + 1);
  }
  paVar11 = &local_250;
  if (local_260 != paVar11) {
    operator_delete(local_260,local_250._M_allocated_capacity + 1);
    paVar11 = extraout_RAX;
  }
  return SUB81(paVar11,0);
}

Assistant:

static bool Register(const char* prefix, CodeLocation code_location,
                       const char* case_name, const char* test_names, int index,
                       const std::vector<std::string>& type_names =
                           GenerateNames<DefaultNameGenerator, Types>()) {
    typedef typename Types::Head Type;
    typedef Fixture<Type> FixtureClass;
    typedef typename GTEST_BIND_(TestSel, Type) TestClass;

    // First, registers the first type-parameterized test in the type
    // list.
    MakeAndRegisterTestInfo(
        (std::string(prefix) + (prefix[0] == '\0' ? "" : "/") + case_name +
         "/" + type_names[static_cast<size_t>(index)]),
        StripTrailingSpaces(GetPrefixUntilComma(test_names)).c_str(),
        GetTypeName<Type>().c_str(),
        nullptr,  // No value parameter.
        code_location, GetTypeId<FixtureClass>(),
        SuiteApiResolver<TestClass>::GetSetUpCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        SuiteApiResolver<TestClass>::GetTearDownCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        new TestFactoryImpl<TestClass>);

    // Next, recurses (at compile time) with the tail of the type list.
    return TypeParameterizedTest<Fixture, TestSel, typename Types::Tail>::
        Register(prefix, std::move(code_location), case_name, test_names,
                 index + 1, type_names);
  }